

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

int Gia_ManCountMark1Dfs_rec(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  uVar3 = 0;
  if (p->pTravIds[iObj] != p->nTravIds) {
    p->pTravIds[iObj] = p->nTravIds;
    if ((iObj < 0) || (p->nObjs <= iObj)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar2 = *(undefined8 *)(p->pObjs + (uint)iObj);
    uVar3 = (uint)uVar2;
    if ((int)uVar3 < 0 || (~uVar3 & 0x1fffffff) == 0) {
      uVar3 = (uint)((ulong)uVar2 >> 0x3e) & 1;
    }
    else {
      pGVar1 = p->pObjs + (uint)iObj;
      iVar4 = Gia_ManCountMark1Dfs_rec(p,iObj - (uVar3 & 0x1fffffff));
      iVar5 = Gia_ManCountMark1Dfs_rec(p,iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
      uVar3 = iVar5 + iVar4 + (uint)((*(ulong *)pGVar1 >> 0x3e & 1) != 0);
    }
  }
  return uVar3;
}

Assistant:

int Gia_ManCountMark1Dfs_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( !Gia_ObjIsAnd(pObj) )
        return pObj->fMark1;
    return Gia_ManCountMark1Dfs_rec( p, Gia_ObjFaninId0(pObj, iObj) ) + 
           Gia_ManCountMark1Dfs_rec( p, Gia_ObjFaninId1(pObj, iObj) ) + pObj->fMark1;
}